

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

void duckdb::Date::ExtractYearOffset(int32_t *n,int32_t *year,int32_t *year_offset)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  
  *year = 0x7b2;
  while (uVar2 = *n, (int)uVar2 < 0) {
    *n = uVar2 + 0x23ab1;
    *year = *year + -400;
  }
  if (0x23ab0 < uVar2) {
    do {
      *n = uVar2 - 0x23ab1;
      *year = *year + 400;
      uVar2 = *n;
    } while (0x23ab0 < (int)uVar2);
  }
  iVar3 = (int)uVar2 / 0x16d;
  piVar4 = (int *)(CUMULATIVE_YEAR_DAYS + (long)iVar3 * 4);
  do {
    *year_offset = iVar3;
    iVar3 = iVar3 + -1;
    iVar1 = *piVar4;
    piVar4 = piVar4 + -1;
  } while (*n < iVar1);
  *year = iVar3 + *year + 1;
  return;
}

Assistant:

void Date::ExtractYearOffset(int32_t &n, int32_t &year, int32_t &year_offset) {
	year = Date::EPOCH_YEAR;
	// first we normalize n to be in the year range [1970, 2370]
	// since leap years repeat every 400 years, we can safely normalize just by "shifting" the CumulativeYearDays array
	while (n < 0) {
		n += Date::DAYS_PER_YEAR_INTERVAL;
		year -= Date::YEAR_INTERVAL;
	}
	while (n >= Date::DAYS_PER_YEAR_INTERVAL) {
		n -= Date::DAYS_PER_YEAR_INTERVAL;
		year += Date::YEAR_INTERVAL;
	}
	// interpolation search
	// we can find an upper bound of the year by assuming each year has 365 days
	year_offset = n / 365;
	// because of leap years we might be off by a little bit: compensate by decrementing the year offset until we find
	// our year
	while (n < Date::CUMULATIVE_YEAR_DAYS[year_offset]) {
		year_offset--;
		D_ASSERT(year_offset >= 0);
	}
	year += year_offset;
	D_ASSERT(n >= Date::CUMULATIVE_YEAR_DAYS[year_offset]);
}